

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void replace_helper(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,qsizetype blen
                   ,QStringView after)

{
  Data *pDVar1;
  value_type *pvVar2;
  QArrayData *data;
  value_type *pvVar3;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  value_type *__value;
  long aalloc;
  char16_t *__dest;
  char16_t *__src;
  long in_FS_OFFSET;
  QStringView after_00;
  DataPointer *str_d;
  char16_t *after_b;
  longlong __n2;
  back_insert_iterator<QVarLengthArray<QChar,_256LL>_> local_260;
  undefined1 local_258 [16];
  undefined1 *local_248;
  QVLABase<QChar> local_58;
  long local_38;
  
  aalloc = after.m_size;
  __value = (value_type *)after.m_data;
  lVar5 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (str->d).d;
  lVar8 = (str->d).size;
  lVar6 = lVar5;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011f82f:
    __src = (str->d).ptr;
    local_248 = &DAT_aaaaaaaaaaaaaaaa;
    local_258._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_258._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)local_258,lVar8 + (aalloc - blen) * lVar5,(Initialization)lVar6);
    __dest = (char16_t *)local_258._8_8_;
    if (lVar5 != 0) {
      lVar8 = 0;
      do {
        lVar6 = *(long *)((long)indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.
                                m_data + lVar8);
        pcVar4 = (str->d).ptr;
        sVar7 = (long)pcVar4 + (lVar6 * 2 - (long)__src);
        if (sVar7 != 0) {
          memmove(__dest,__src,sVar7);
        }
        __dest = (char16_t *)((long)__dest + sVar7);
        if (0 < aalloc) {
          memmove(__dest,__value,aalloc * 2);
          __dest = __dest + aalloc;
        }
        __src = pcVar4 + lVar6 + blen;
        lVar8 = lVar8 + 8;
      } while (lVar5 << 3 != lVar8);
    }
    pcVar4 = (str->d).ptr;
    lVar8 = (str->d).size;
    sVar7 = (long)pcVar4 + (lVar8 * 2 - (long)__src);
    if (sVar7 != 0) {
      memmove(__dest,__src,sVar7);
      pcVar4 = (str->d).ptr;
      lVar8 = (str->d).size;
    }
    data = &((str->d).d)->super_QArrayData;
    (str->d).d = (Data *)local_258._0_8_;
    (str->d).ptr = (char16_t *)local_258._8_8_;
    (str->d).size = (qsizetype)local_248;
    local_258._0_8_ = data;
    local_258._8_8_ = pcVar4;
    local_248 = (undefined1 *)lVar8;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  else {
    lVar6 = (aalloc - blen) * lVar5 + lVar8;
    pvVar2 = (value_type *)(str->d).ptr;
    if ((pDVar1->super_QArrayData).alloc -
        ((long)((long)pvVar2 -
               ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <
        lVar6) goto LAB_0011f82f;
    pvVar3 = (value_type *)L"";
    if (pvVar2 != (value_type *)0x0) {
      pvVar3 = pvVar2;
    }
    if (pvVar3 + lVar8 <= __value || __value < pvVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        replace_in_place(str,indices,blen,after);
        return;
      }
      goto LAB_0011fad0;
    }
    local_58.super_QVLABaseBase.a = 0x100;
    local_58.super_QVLABaseBase.s = 0;
    local_58.super_QVLABaseBase.ptr = (QVarLengthArray<QChar,_256LL> *)local_258;
    if (aalloc < 0x101) {
      local_260.container = (QVarLengthArray<QChar,_256LL> *)local_258;
      if (0 < aalloc) goto LAB_0011fa5d;
    }
    else {
      QVLABase<QChar>::reallocate_impl(&local_58,0x100,local_258,0,aalloc);
LAB_0011fa5d:
      local_260.container = (QVarLengthArray<QChar,_256LL> *)local_258;
      uVar9 = aalloc + 1;
      do {
        std::back_insert_iterator<QVarLengthArray<QChar,_256LL>_>::operator=(&local_260,__value);
        __value = __value + 1;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
    after_00.m_size = local_58.super_QVLABaseBase.s;
    after_00.m_data = (storage_type_conflict *)local_58.super_QVLABaseBase.ptr;
    replace_in_place(str,indices,blen,after_00);
    if ((QVarLengthArray<QChar,_256LL> *)local_58.super_QVLABaseBase.ptr !=
        (QVarLengthArray<QChar,_256LL> *)local_258) {
      QtPrivate::sizedFree(local_58.super_QVLABaseBase.ptr,local_58.super_QVLABaseBase.a * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011fad0:
  __stack_chk_fail();
}

Assistant:

static void replace_helper(QString &str, QSpan<size_t> indices, qsizetype blen, QStringView after)
{
    const qsizetype oldSize = str.data_ptr().size;
    const qsizetype adjust = indices.size() * (after.size() - blen);
    const qsizetype newSize = oldSize + adjust;
    if (str.data_ptr().needsDetach() || needsReallocate(str, newSize)) {
        replace_with_copy(str, indices, blen, after);
        return;
    }

    if (QtPrivate::q_points_into_range(after.begin(), str))
        // Copy after if it lies inside our own d.b area (which we could
        // possibly invalidate via a realloc or modify by replacement)
        replace_in_place(str, indices, blen, QVarLengthArray(after.begin(), after.end()));
    else
        replace_in_place(str, indices, blen, after);
}